

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_http_proxy_get_destination
                   (Curl_cfilter *cf,char **phostname,int *pport,_Bool *pipv6_ip)

{
  char *pcVar1;
  _Bool *pipv6_ip_local;
  int *pport_local;
  char **phostname_local;
  Curl_cfilter *cf_local;
  
  if (((ulong)cf->conn->bits >> 8 & 1) == 0) {
    if (cf->sockindex == 1) {
      *phostname = cf->conn->secondaryhostname;
    }
    else {
      *phostname = (cf->conn->host).name;
    }
  }
  else {
    *phostname = (cf->conn->conn_to_host).name;
  }
  if (cf->sockindex == 1) {
    *pport = (uint)cf->conn->secondary_port;
  }
  else if (((ulong)cf->conn->bits >> 9 & 1) == 0) {
    *pport = cf->conn->remote_port;
  }
  else {
    *pport = cf->conn->conn_to_port;
  }
  if (*phostname == (cf->conn->host).name) {
    *pipv6_ip = ((ulong)cf->conn->bits >> 10 & 1) != 0;
  }
  else {
    pcVar1 = strchr(*phostname,0x3a);
    *pipv6_ip = pcVar1 != (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_proxy_get_destination(struct Curl_cfilter *cf,
                                         const char **phostname,
                                         int *pport, bool *pipv6_ip)
{
  DEBUGASSERT(cf);
  DEBUGASSERT(cf->conn);

  if(cf->conn->bits.conn_to_host)
    *phostname = cf->conn->conn_to_host.name;
  else if(cf->sockindex == SECONDARYSOCKET)
    *phostname = cf->conn->secondaryhostname;
  else
    *phostname = cf->conn->host.name;

  if(cf->sockindex == SECONDARYSOCKET)
    *pport = cf->conn->secondary_port;
  else if(cf->conn->bits.conn_to_port)
    *pport = cf->conn->conn_to_port;
  else
    *pport = cf->conn->remote_port;

  if(*phostname != cf->conn->host.name)
    *pipv6_ip = (strchr(*phostname, ':') != NULL);
  else
    *pipv6_ip = cf->conn->bits.ipv6_ip;

  return CURLE_OK;
}